

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O2

void __thiscall Graph<Node>::Graph(Graph<Node> *this,Graph<Node> *other)

{
  vector<NodeList<Node>_>::vector(&this->G);
  vector<Edge>::vector(&this->edges);
  vector<vector<int>_>::vector(&this->minDist);
  vector<vector<int>_>::vector(&this->nextNodeInPath);
  vector<vector<int>_>::vector(&this->compList);
  vector<int>::vector(&this->inCC);
  operator=(this,other);
  return;
}

Assistant:

Graph(const Graph &other) {
        *this = other;
//        _nodeCnt = other._nodeCnt;
//        _edgeCnt = other._edgeCnt;
//        G = other.G;
//        edges = other.edges;
//        minDist = other.minDist;
//        nextNodeInPath = other.nextNodeInPath;
    }